

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fire::arg::_convert<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,arg *this,bool dec_main_argc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  ulong *puVar7;
  size_type sVar8;
  _Alloc_hider _Var9;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78 [2];
  long local_68 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  _get<std::__cxx11::string>(&local_58,this);
  bVar3 = local_58._exists;
  pcVar2 = (this->_id)._longer._M_dataplus._M_p;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar2,pcVar2 + (this->_id)._longer._M_string_length);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x1431ca);
  local_98 = &local_88;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar4[3];
  }
  else {
    local_88 = *plVar6;
    local_98 = (long *)*plVar4;
  }
  local_90 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar1 = &local_b8.field_2;
  puVar7 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8.field_2._8_8_ = plVar4[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar7;
    local_b8._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_b8._M_string_length = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (_storage<void>::matcher[0x185] == 0) {
    if (bVar3 == false) {
      if (local_b8._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error",5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,": ",2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_b8._M_dataplus._M_p,
                            local_b8._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      goto LAB_0010dd17;
    }
  }
  else if (bVar3 == false) {
    _first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::set((_first<fire::identifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(_storage<void>::matcher + 0x68),&this->_id,&local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  _storage<void>::matcher._384_4_ = _storage<void>::matcher._384_4_ - (uint)dec_main_argc;
  if (((int)_storage<void>::matcher._384_4_ < 1 & _storage<void>::matcher[0x185]) == 1) {
    if (_storage<void>::matcher[0x186] == '\x01') {
      _help_logger::print_help((_help_logger *)_storage<void>::help_logger);
      exit(0);
    }
    _matcher::check_named((_matcher *)_storage<void>::matcher);
    _matcher::check_positional((_matcher *)_storage<void>::matcher);
    if (_storage<void>::matcher[0x178] == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)_storage<void>::matcher._344_8_,
                          _storage<void>::matcher._352_8_);
      std::endl<char,std::char_traits<char>>(poVar5);
LAB_0010dd17:
      exit(1);
    }
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity =
       local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar8 = 0;
  _Var9._M_p = (pointer)paVar1;
  if (local_58._exists != false) {
    sVar8 = local_58._value._M_string_length;
    _Var9._M_p = local_58._value._M_dataplus._M_p;
  }
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,_Var9._M_p,sVar8 + (long)_Var9._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._value._M_dataplus._M_p != &local_58._value.field_2) {
    operator_delete(local_58._value._M_dataplus._M_p,
                    local_58._value.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

T arg::_convert(bool dec_main_argc) {
        optional<T> val = _get_with_precision<T>();
        _::matcher.deferred_assert(_id, val.has_value(),
                                   "required argument " + _id.longer() + " not provided");
        _::matcher.check(dec_main_argc);
        return val.value_or(T());
    }